

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Value
chaiscript::Boxed_Number::binary_go<unsigned_short,unsigned_long>
          (Opers t_oper,unsigned_short *t,unsigned_long *u,Boxed_Value *t_lhs)

{
  undefined8 uVar1;
  ulong *in_RCX;
  ushort *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_ESI;
  element_type *in_RDI;
  Boxed_Value BVar2;
  Boxed_Value *in_stack_ffffffffffffffa8;
  Boxed_Value *in_stack_ffffffffffffffb0;
  undefined4 in_stack_fffffffffffffff0;
  
  switch(in_ESI) {
  case 8:
    *in_RDX = (ushort)*in_RCX;
    break;
  default:
    uVar1 = __cxa_allocate_exception(0x28);
    chaiscript::detail::exception::bad_any_cast::bad_any_cast((bad_any_cast *)in_RDI);
    __cxa_throw(uVar1,&chaiscript::detail::exception::bad_any_cast::typeinfo,
                chaiscript::detail::exception::bad_any_cast::~bad_any_cast);
  case 0xb:
    *in_RDX = *in_RDX * (short)*in_RCX;
    break;
  case 0xc:
    *in_RDX = *in_RDX + (short)*in_RCX;
    break;
  case 0xd:
    check_divide_by_zero<unsigned_long>(CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
    *in_RDX = (ushort)((ulong)*in_RDX / *in_RCX);
    break;
  case 0xe:
    *in_RDX = *in_RDX - (short)*in_RCX;
  }
  Boxed_Value::Boxed_Value(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value binary_go(Operators::Opers t_oper, T &t, const U &u, const Boxed_Value &t_lhs) 
      {
        switch (t_oper)
        {
          case Operators::assign:
            t = u;
            break;
          case Operators::assign_product:
            t *= u;
            break;
          case Operators::assign_sum:
            t += u;
            break;
          case Operators::assign_quotient:
            check_divide_by_zero(u);
            t /= u;
            break;
          case Operators::assign_difference:
            t -= u;
            break;
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }

        return t_lhs;
      }